

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffBoundsImp<0>::filterlower(AllDiffBoundsImp<0> *this)

{
  interval *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  interval *piVar6;
  IntVar *pIVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  int l_1;
  int l;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar19;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar20;
  int iVar21;
  int iVar22;
  AllDiffBoundsImp<0> *local_88;
  long local_80;
  long local_78;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar18;
  
  if (-1 < this->nb) {
    piVar13 = this->bounds;
    piVar2 = this->t;
    piVar3 = this->h;
    piVar4 = this->d;
    piVar5 = this->bucket;
    lVar19 = 0;
    do {
      iVar12 = piVar13[lVar19 + 1];
      piVar3[lVar19 + 1] = (int)lVar19;
      piVar2[lVar19 + 1] = (int)lVar19;
      piVar4[lVar19 + 1] = iVar12 - piVar13[lVar19];
      piVar5[lVar19 + 1] = -1;
      lVar19 = lVar19 + 1;
    } while (lVar19 <= this->nb);
  }
  if (0 < this->sz) {
    lVar19 = 0;
    do {
      piVar6 = this->iv;
      piVar13 = this->maxsorted;
      piVar1 = piVar6 + piVar13[lVar19];
      local_64 = piVar1->minrank;
      local_60 = piVar1->maxrank;
      local_50 = (long)local_60;
      piVar2 = this->t;
      iVar16 = local_64 + 1;
      iVar12 = iVar16;
      do {
        iVar21 = iVar12;
        iVar12 = piVar2[iVar21];
      } while (iVar21 < iVar12);
      piVar3 = this->bucket;
      piVar1->next = piVar3[iVar21];
      piVar3[iVar21] = piVar13[lVar19];
      piVar13 = this->d + iVar21;
      *piVar13 = *piVar13 + -1;
      if (*piVar13 == 0) {
        piVar2[iVar21] = iVar21 + 1;
        iVar22 = iVar21 + 1;
        do {
          iVar21 = iVar22;
          iVar22 = piVar2[iVar21];
        } while (iVar21 < piVar2[iVar21]);
        piVar2[iVar21] = iVar12;
      }
      while (iVar16 != iVar21) {
        iVar22 = piVar2[iVar16];
        piVar2[iVar16] = iVar21;
        iVar16 = iVar22;
      }
      iVar16 = this->h[local_64];
      if (local_64 < iVar16) {
        piVar13 = this->bounds;
        do {
          iVar22 = iVar16;
          lVar20 = (long)iVar22;
          iVar16 = this->h[lVar20];
        } while (iVar22 < iVar16);
        iVar16 = piVar13[lVar20];
        local_80 = (long)iVar16;
        if (so.lazy == true) {
          iVar11 = piVar13[local_64];
          lVar14 = lVar20;
          if (iVar11 < iVar16) {
            do {
              uVar9 = piVar3[lVar14];
              while (-1 < (int)uVar9) {
                uVar17 = (ulong)uVar9;
                uVar18 = (ulong)uVar9;
                uVar9 = piVar6[uVar17].next;
                if (piVar6[uVar18].min < iVar11) {
                  iVar11 = piVar6[uVar18].min;
                }
              }
              lVar8 = lVar14 + -1;
              lVar14 = lVar14 + -1;
            } while (iVar11 < piVar13[lVar8]);
          }
          local_78 = lVar20;
          local_88 = (AllDiffBoundsImp<0> *)malloc((long)((iVar16 - iVar11) * 2) * 4 + 0x14);
          *(uint *)&(local_88->super_Propagator)._vptr_Propagator =
               (iVar16 - iVar11) * 0x200 + 0x302;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_88);
          local_70._pt = (Clause *)local_88;
          local_38 = (long)iVar11;
          pIVar7 = this->x[this->maxsorted[lVar19]].var;
          uVar9 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])(pIVar7,local_38,2);
          r = local_70;
          if (*(uint *)local_70._pt < 0x200) goto LAB_0015666b;
          *(uint *)(local_70._a + 8) = uVar9 ^ 1;
          piVar13 = this->bounds;
          if (iVar11 < piVar13[local_78]) {
            local_40 = local_80 + -1;
            iVar15 = 3;
            lVar20 = local_78;
            local_5c = iVar22;
            local_58 = iVar21;
            local_54 = iVar12;
            local_48 = lVar19;
            do {
              uVar9 = this->bucket[lVar20];
              lVar14 = lVar20;
              if (-1 < (int)uVar9) {
                lVar19 = (long)iVar15 + 1;
                local_78 = lVar20;
                do {
                  local_70._pt = (Clause *)(lVar19 + -1);
                  pIVar7 = this->x[uVar9].var;
                  uVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar7,local_38,2);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= (long)local_70._pt) goto LAB_0015666b;
                  (r._pt)->data[lVar19 + -1].x = uVar10 ^ 1;
                  pIVar7 = this->x[uVar9].var;
                  uVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar7,local_40,3);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= lVar19) goto LAB_0015666b;
                  (r._pt)->data[lVar19].x = uVar10 ^ 1;
                  uVar9 = this->iv[uVar9].next;
                  lVar19 = lVar19 + 2;
                  iVar15 = iVar15 + 2;
                } while (-1 < (int)uVar9);
                piVar13 = this->bounds;
                lVar14 = local_78;
                lVar19 = local_48;
                iVar12 = local_54;
                iVar21 = local_58;
                iVar22 = local_5c;
              }
              lVar20 = lVar14 + -1;
            } while (iVar11 < piVar13[lVar14 + -1]);
          }
        }
        else {
          r._pt = (Clause *)0x0;
        }
        uVar9 = (this->b).v;
        if (sat.assigns.data[uVar9] == 0) {
          pIVar7 = this->x[this->maxsorted[lVar19]].var;
          if ((pIVar7->max).v < iVar16) {
            iVar12 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])(pIVar7,local_80,2);
            if (0x2ff < *(uint *)r) {
              *(int *)((long)r + 0xc) = iVar12;
              SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)r);
              return sat.confl == (Clause *)0x0;
            }
            goto LAB_0015666b;
          }
        }
        else {
          if (*(uint *)r < 0x300) {
LAB_0015666b:
            abort();
          }
          *(uint *)((long)r + 0xc) = (uint)((byte)sat.assigns.data[uVar9] < 0xfe) + uVar9 * 2;
          pIVar7 = this->x[this->maxsorted[lVar19]].var;
          iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,local_80,r,1);
          if ((char)iVar11 == '\0') {
            return false;
          }
          piVar13 = this->maxsorted;
          this->iv[piVar13[lVar19]].min = iVar16;
          if ((iVar16 < ((this->x[piVar13[lVar19]].var)->min).v) &&
             ((this->super_Propagator).in_queue == false)) {
            (this->super_Propagator).in_queue = true;
            local_88 = this;
            vec<Propagator_*>::push
                      (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                       (Propagator **)&local_88);
          }
          if (local_64 != iVar22) {
            piVar13 = this->h;
            do {
              iVar16 = piVar13[local_64];
              piVar13[local_64] = iVar22;
              local_64 = iVar16;
            } while (iVar16 != iVar22);
          }
        }
      }
      if (this->d[iVar21] == this->bounds[iVar21] - this->bounds[local_50]) {
        piVar13 = this->h;
        iVar16 = piVar13[local_50];
        while (iVar16 != iVar12 + -1) {
          iVar21 = piVar13[iVar16];
          piVar13[iVar16] = local_60;
          iVar16 = iVar21;
        }
        piVar13[local_50] = iVar12 + -1;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < this->sz);
  }
  return true;
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}